

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Set_restricted(int g_a,int *list,int size)

{
  void *__ptr;
  int in_EDX;
  long in_RSI;
  Integer *_ga_map_capi;
  Integer *in_stack_00000008;
  int i;
  Integer asize;
  Integer aa;
  undefined4 local_2c;
  
  __ptr = malloc((long)in_EDX << 3);
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    *(long *)((long)__ptr + (long)local_2c * 8) = (long)*(int *)(in_RSI + (long)local_2c * 4);
  }
  pnga_set_restricted(asize,in_stack_00000008,(Integer)_ga_map_capi);
  free(__ptr);
  return;
}

Assistant:

void NGA_Set_restricted(int g_a, int list[], int size)
{
    Integer aa;
    Integer asize = (Integer)size;
    int i;
    Integer *_ga_map_capi;
    aa = (Integer)g_a;
    _ga_map_capi = (Integer*)malloc(size * sizeof(Integer));
    for (i=0; i<size; i++)
       _ga_map_capi[i] = (Integer)list[i];
    wnga_set_restricted(aa,_ga_map_capi,asize);
    free(_ga_map_capi);
}